

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  bool bVar1;
  long in_RSI;
  undefined1 local_28 [16];
  int i;
  MergingIterator *this_local;
  Status *status;
  
  local_28[0xf] = 0;
  this_local = this;
  Status::Status((Status *)this);
  local_28._8_4_ = 0;
  while( true ) {
    if (*(int *)(in_RSI + 0x38) <= (int)local_28._8_4_) {
      return (Status)(char *)this;
    }
    IteratorWrapper::status((IteratorWrapper *)local_28);
    Status::operator=((Status *)this,(Status *)local_28);
    Status::~Status((Status *)local_28);
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) break;
    local_28._8_4_ = local_28._8_4_ + 1;
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }